

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_get_outgoing_window(SESSION_HANDLE session,uint32_t *outgoing_window)

{
  SESSION_INSTANCE *session_instance;
  int result;
  uint32_t *outgoing_window_local;
  SESSION_HANDLE session_local;
  
  if ((session == (SESSION_HANDLE)0x0) || (outgoing_window == (uint32_t *)0x0)) {
    session_instance._4_4_ = 0x411;
  }
  else {
    *outgoing_window = session->outgoing_window;
    session_instance._4_4_ = 0;
  }
  return session_instance._4_4_;
}

Assistant:

int session_get_outgoing_window(SESSION_HANDLE session, uint32_t* outgoing_window)
{
    int result;

    if ((session == NULL) ||
        (outgoing_window == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        *outgoing_window = session_instance->outgoing_window;

        result = 0;
    }

    return result;
}